

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * __thiscall json::Object::stringify_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  string *psVar1;
  ostream *poVar2;
  Type *pTVar3;
  _Rb_tree_node_base *p_Var4;
  stringstream stream;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{",1);
  local_1c0 = __return_storage_ptr__;
  for (p_Var4 = (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->fields)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4 != (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    pTVar3 = common::XPtr<json::Type>::operator->((XPtr<json::Type> *)(p_Var4 + 2));
    (*pTVar3->_vptr_Type[1])(&local_1e0,pTVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1e0,local_1d8);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}",1);
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << "{";
            for_each_c (Fields, fields, field) {
                if (field != fields.begin()) stream << ", ";
                stream << "\"" << field->first << "\"" << ": " << field->second->stringify();
            }
            stream << "}";
            return stream.str();
        }